

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-ctest.c
# Opt level: O3

void test29(char *infile,char *password,char *outfile,char *xarg)

{
  char *pcVar1;
  qpdf_data p_Var2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  
  qpdf_silence_errors(qpdf);
  iVar3 = qpdf_get_root(qpdf);
  handle_oh_error(qpdf,"get root");
  if (iVar3 == 0) {
    __assert_fail("root != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                  ,0x38a,"void test29(const char *, const char *, const char *, const char *)");
  }
  iVar3 = qpdf_oh_is_initialized(qpdf,iVar3);
  p_Var2 = qpdf;
  if (iVar3 != 0) {
    __assert_fail("!qpdf_oh_is_initialized(qpdf, root)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                  ,0x38b,"void test29(const char *, const char *, const char *, const char *)");
  }
  uVar4 = qpdf_oh_parse(qpdf,"[oops");
  iVar3 = qpdf_oh_is_initialized(p_Var2,uVar4);
  if (iVar3 != 0) {
    __assert_fail("!qpdf_oh_is_initialized(qpdf, qpdf_oh_parse(qpdf, \"[oops\"))",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                  ,0x38d,"void test29(const char *, const char *, const char *, const char *)");
  }
  handle_oh_error(qpdf,"bad parse");
  report_errors();
  p_Var2 = qpdf;
  uVar4 = qpdf_oh_new_string(qpdf,"x");
  iVar3 = qpdf_oh_get_int_value_as_int(p_Var2,uVar4);
  if (iVar3 != 0) {
    __assert_fail("qpdf_oh_get_int_value_as_int(qpdf, qpdf_oh_new_string(qpdf, \"x\")) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                  ,0x391,"void test29(const char *, const char *, const char *, const char *)");
  }
  handle_oh_error(qpdf,"type mismatch (int operation on string)");
  uVar4 = qpdf_oh_new_integer(qpdf,0xc);
  pcVar1 = (char *)qpdf_oh_get_string_value(qpdf,uVar4);
  if (*pcVar1 != '\0') {
    __assert_fail("strlen(qpdf_oh_get_string_value(qpdf, int_oh)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                  ,0x394,"void test29(const char *, const char *, const char *, const char *)");
  }
  handle_oh_error(qpdf,"type mismatch (string operation on int)");
  iVar3 = qpdf_oh_get_array_n_items(qpdf,uVar4);
  if (iVar3 != 0) {
    __assert_fail("qpdf_oh_get_array_n_items(qpdf, int_oh) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                  ,0x399,"void test29(const char *, const char *, const char *, const char *)");
  }
  handle_oh_error(qpdf,"array type mismatch - n_items");
  p_Var2 = qpdf;
  uVar5 = qpdf_oh_get_array_item(qpdf,uVar4,3);
  iVar3 = qpdf_oh_is_null(p_Var2,uVar5);
  if (iVar3 == 0) {
    __assert_fail("qpdf_oh_is_null(qpdf, qpdf_oh_get_array_item(qpdf, int_oh, 3))",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                  ,0x39b,"void test29(const char *, const char *, const char *, const char *)");
  }
  handle_oh_error(qpdf,"array type mismatch - item");
  p_Var2 = qpdf;
  uVar5 = qpdf_oh_new_null(qpdf);
  qpdf_oh_append_item(p_Var2,uVar4,uVar5);
  handle_oh_error(qpdf,"append to non-array");
  uVar5 = qpdf_oh_new_array(qpdf);
  p_Var2 = qpdf;
  uVar5 = qpdf_oh_get_array_item(qpdf,uVar5,3);
  iVar3 = qpdf_oh_is_null(p_Var2,uVar5);
  if (iVar3 != 0) {
    handle_oh_error(qpdf,"array bounds");
    qpdf_oh_begin_dict_key_iter(qpdf,uVar4);
    iVar3 = qpdf_oh_dict_more_keys(qpdf);
    if (iVar3 != 0) {
      __assert_fail("qpdf_oh_dict_more_keys(qpdf) == QPDF_FALSE",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                    ,0x3a4,"void test29(const char *, const char *, const char *, const char *)");
    }
    handle_oh_error(qpdf,"dictionary iter type mismatch");
    p_Var2 = qpdf;
    uVar5 = qpdf_oh_get_key(qpdf,uVar4,"potato");
    iVar3 = qpdf_oh_is_null(p_Var2,uVar5);
    if (iVar3 != 0) {
      handle_oh_error(qpdf,"dictionary type mismatch");
      iVar3 = qpdf_oh_has_key(qpdf,uVar4,"potato");
      if (iVar3 == 0) {
        handle_oh_error(qpdf,"dictionary type mismatch");
        report_errors();
        return;
      }
      __assert_fail("qpdf_oh_has_key(qpdf, int_oh, \"potato\") == QPDF_FALSE",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                    ,0x3a8,"void test29(const char *, const char *, const char *, const char *)");
    }
    __assert_fail("qpdf_oh_is_null(qpdf, qpdf_oh_get_key(qpdf, int_oh, \"potato\"))",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                  ,0x3a6,"void test29(const char *, const char *, const char *, const char *)");
  }
  __assert_fail("qpdf_oh_is_null(qpdf, qpdf_oh_get_array_item(qpdf, array, 3))",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                ,0x3a0,"void test29(const char *, const char *, const char *, const char *)");
}

Assistant:

static void
test29(char const* infile, char const* password, char const* outfile, char const* xarg)
{
    /* Trap exceptions thrown by object accessors. Type mismatches are
     * errors rather than warnings when they don't have an owning QPDF
     * object.
     */
    qpdf_silence_errors(qpdf);

    /* get_root fails when we have no trailer */
    qpdf_oh root = qpdf_get_root(qpdf);
    handle_oh_error(qpdf, "get root");
    assert(root != 0);
    assert(!qpdf_oh_is_initialized(qpdf, root));

    assert(!qpdf_oh_is_initialized(qpdf, qpdf_oh_parse(qpdf, "[oops")));
    handle_oh_error(qpdf, "bad parse");
    report_errors();

    assert(qpdf_oh_get_int_value_as_int(qpdf, qpdf_oh_new_string(qpdf, "x")) == 0);
    handle_oh_error(qpdf, "type mismatch (int operation on string)");
    qpdf_oh int_oh = qpdf_oh_new_integer(qpdf, 12);
    assert(strlen(qpdf_oh_get_string_value(qpdf, int_oh)) == 0);
    handle_oh_error(qpdf, "type mismatch (string operation on int)");

    // This doesn't test every possible error flow, but it tests each
    // way of handling errors in the library code.
    assert(qpdf_oh_get_array_n_items(qpdf, int_oh) == 0);
    handle_oh_error(qpdf, "array type mismatch - n_items");
    assert(qpdf_oh_is_null(qpdf, qpdf_oh_get_array_item(qpdf, int_oh, 3)));
    handle_oh_error(qpdf, "array type mismatch - item");
    qpdf_oh_append_item(qpdf, int_oh, qpdf_oh_new_null(qpdf));
    handle_oh_error(qpdf, "append to non-array");
    qpdf_oh array = qpdf_oh_new_array(qpdf);
    assert(qpdf_oh_is_null(qpdf, qpdf_oh_get_array_item(qpdf, array, 3)));
    handle_oh_error(qpdf, "array bounds");

    qpdf_oh_begin_dict_key_iter(qpdf, int_oh);
    assert(qpdf_oh_dict_more_keys(qpdf) == QPDF_FALSE);
    handle_oh_error(qpdf, "dictionary iter type mismatch");
    assert(qpdf_oh_is_null(qpdf, qpdf_oh_get_key(qpdf, int_oh, "potato")));
    handle_oh_error(qpdf, "dictionary type mismatch");
    assert(qpdf_oh_has_key(qpdf, int_oh, "potato") == QPDF_FALSE);
    handle_oh_error(qpdf, "dictionary type mismatch");

    report_errors();
}